

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.cpp
# Opt level: O2

void __thiscall ncnn::UnlockedPoolAllocator::~UnlockedPoolAllocator(UnlockedPoolAllocator *this)

{
  _List_node_base *p_Var1;
  UnlockedPoolAllocatorPrivate *this_00;
  
  (this->super_Allocator)._vptr_Allocator = (_func_int **)&PTR__UnlockedPoolAllocator_0052d488;
  clear(this);
  this_00 = this->d;
  if ((this_00->payouts).
      super__List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
      ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&this_00->payouts) {
    fwrite("FATAL ERROR! unlocked pool allocator destroyed too early",0x38,1,_stderr);
    fputc(10,_stderr);
    this_00 = this->d;
    p_Var1 = (_List_node_base *)&this_00->payouts;
    while (p_Var1 = (((_List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
                       *)&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var1 != (_List_node_base *)&this_00->payouts) {
      fprintf(_stderr,"%p still in use",p_Var1[1]._M_prev);
      fputc(10,_stderr);
      this_00 = this->d;
    }
    if (this_00 == (UnlockedPoolAllocatorPrivate *)0x0) {
      this_00 = (UnlockedPoolAllocatorPrivate *)0x0;
      goto LAB_00168047;
    }
  }
  UnlockedPoolAllocatorPrivate::~UnlockedPoolAllocatorPrivate(this_00);
LAB_00168047:
  operator_delete(this_00,0x38);
  return;
}

Assistant:

UnlockedPoolAllocator::~UnlockedPoolAllocator()
{
    clear();

    if (!d->payouts.empty())
    {
        NCNN_LOGE("FATAL ERROR! unlocked pool allocator destroyed too early");
#if NCNN_STDIO
        std::list<std::pair<size_t, void*> >::iterator it = d->payouts.begin();
        for (; it != d->payouts.end(); ++it)
        {
            void* ptr = it->second;
            NCNN_LOGE("%p still in use", ptr);
        }
#endif
    }

    delete d;
}